

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

void free_node(_node_t *n)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = n->num_children;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (n->children[uVar2] != (_node_t *)0x0) {
        free_node(n->children[uVar2]);
        uVar1 = n->num_children;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  if (n->children != (_node_s **)0x0) {
    free(n->children);
  }
  free(n);
  return;
}

Assistant:

void free_node(_node_t* n)
{
    unsigned int i;
    for (i = 0; i < n->num_children; i++)
    {
        if (n->children[i])
            free_node(n->children[i]);
    }

    if (n->children)
        free(n->children);

    free(n);
}